

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data.cc
# Opt level: O0

bool __thiscall
bssl::ParsePublicKey(bssl *this,Input public_key_spki,UniquePtr<EVP_PKEY> *public_key)

{
  bool bVar1;
  uint8_t *data;
  size_t sVar2;
  EVP_PKEY *__p;
  unique_ptr *this_00;
  undefined1 local_40 [8];
  CBS cbs;
  OpenSSLErrStackTracer err_tracer;
  UniquePtr<EVP_PKEY> *public_key_local;
  Input public_key_spki_local;
  
  this_00 = (unique_ptr *)public_key_spki.data_.size_;
  public_key_spki_local.data_.data_ = public_key_spki.data_.data_;
  public_key_local = (UniquePtr<EVP_PKEY> *)this;
  data = der::Input::data((Input *)&public_key_local);
  sVar2 = der::Input::size((Input *)&public_key_local);
  CBS_init((CBS *)local_40,data,sVar2);
  __p = EVP_parse_public_key((CBS *)local_40);
  ::std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_00,__p);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool(this_00);
  if ((bVar1) && (sVar2 = CBS_len((CBS *)local_40), sVar2 == 0)) {
    public_key_spki_local.data_.size_._7_1_ = 1;
  }
  else {
    ::std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::reset
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_00,(pointer)0x0);
    public_key_spki_local.data_.size_._7_1_ = 0;
  }
  anon_unknown_0::OpenSSLErrStackTracer::~OpenSSLErrStackTracer
            ((OpenSSLErrStackTracer *)((long)&cbs.len + 7));
  return (bool)(public_key_spki_local.data_.size_._7_1_ & 1);
}

Assistant:

bool ParsePublicKey(der::Input public_key_spki,
                    bssl::UniquePtr<EVP_PKEY> *public_key) {
  // Parse the SPKI to an EVP_PKEY.
  OpenSSLErrStackTracer err_tracer;

  CBS cbs;
  CBS_init(&cbs, public_key_spki.data(), public_key_spki.size());
  public_key->reset(EVP_parse_public_key(&cbs));
  if (!*public_key || CBS_len(&cbs) != 0) {
    public_key->reset();
    return false;
  }
  return true;
}